

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

void __thiscall GlobOpt::ForwardPass(GlobOpt *this)

{
  Type *this_00;
  JitArenaAllocator *pJVar1;
  BasicBlock *pBVar2;
  Type pBVar3;
  code *pcVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  RegSlot RVar8;
  JITTimeFunctionBody *pJVar9;
  FunctionJITTimeInfo *pFVar10;
  SparseArray<Value> *pSVar11;
  BVSparse<Memory::JitArenaAllocator> *pBVar12;
  Func *pFVar13;
  undefined4 *puVar14;
  BVSparseNode *pBVar15;
  BVSparseNode *pBVar16;
  uint32 chunkSize;
  BasicBlock *pBVar17;
  uint uVar18;
  uint uVar19;
  undefined1 local_258 [8];
  IntConstantToStackSymMap localIntConstantToStackSymMap;
  IntConstantToValueMap localIntConstantToValueMap;
  Int64ConstantToValueMap localInt64ConstantToValueMap;
  AddrConstantToValueMap localAddrConstantToValueMap;
  StringConstantToValueMap localStringConstantToValueMap;
  SymIdToInstrMap localPrePassInstrMap;
  ValueSetByValueNumber localValuesCreatedForClone;
  ValueNumberPairToValueMap localValuesCreatedForMerge;
  OpndList localNoImplicitCallUsesToInsert;
  undefined1 local_40 [8];
  AutoCodeGenPhase __autoCodeGen;
  
  local_40 = (undefined1  [8])this->func;
  __autoCodeGen.func._0_4_ = 0x68;
  Func::BeginPhase((Func *)local_40,ForwardPhase);
  pJVar9 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  uVar6 = JITTimeFunctionBody::GetSourceContextId(pJVar9);
  pFVar10 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  uVar7 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar10);
  bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,GlobOptPhase,uVar6,uVar7);
  if (bVar5) {
    Func::DumpHeader(this->func);
  }
  bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,GlobOptPhase);
  if (bVar5) {
    TraceSettings(this);
  }
  pJVar1 = this->alloc;
  pJVar9 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  RVar8 = JITTimeFunctionBody::GetConstCount(pJVar9);
  chunkSize = 0x40;
  if (0x40 < RVar8) {
    chunkSize = RVar8;
  }
  pSVar11 = SparseArray<Value>::New(&pJVar1->super_ArenaAllocator,chunkSize);
  this->byteCodeConstantValueArray = pSVar11;
  pBVar12 = (BVSparse<Memory::JitArenaAllocator> *)
            new<Memory::JitArenaAllocator>(0x20,this->alloc,0x3eba5c);
  pJVar1 = this->alloc;
  pBVar12->head = (Type_conflict)0x0;
  pBVar12->lastFoundIndex = (Type_conflict)0x0;
  pBVar12->alloc = pJVar1;
  pBVar12->lastUsedNodePrevNextField = (Type)pBVar12;
  this->byteCodeConstantValueNumbersBv = pBVar12;
  pBVar12 = (BVSparse<Memory::JitArenaAllocator> *)
            new<Memory::JitArenaAllocator>(0x20,this->alloc,0x3eba5c);
  pJVar1 = this->alloc;
  pBVar12->head = (Type_conflict)0x0;
  pBVar12->lastFoundIndex = (Type_conflict)0x0;
  pBVar12->alloc = pJVar1;
  pBVar12->lastUsedNodePrevNextField = (Type)pBVar12;
  this->tempBv = pBVar12;
  pBVar12 = (BVSparse<Memory::JitArenaAllocator> *)
            new<Memory::JitArenaAllocator>(0x20,this->alloc,0x3eba5c);
  pJVar1 = this->alloc;
  pBVar12->head = (Type_conflict)0x0;
  pBVar12->lastFoundIndex = (Type_conflict)0x0;
  pBVar12->alloc = pJVar1;
  pBVar12->lastUsedNodePrevNextField = (Type)pBVar12;
  this->prePassCopyPropSym = pBVar12;
  pBVar12 = (BVSparse<Memory::JitArenaAllocator> *)
            new<Memory::JitArenaAllocator>(0x20,this->alloc,0x3eba5c);
  pJVar1 = this->alloc;
  pBVar12->head = (Type_conflict)0x0;
  pBVar12->lastFoundIndex = (Type_conflict)0x0;
  pBVar12->alloc = pJVar1;
  pBVar12->lastUsedNodePrevNextField = (Type)pBVar12;
  this->slotSyms = pBVar12;
  this->byteCodeUses = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->propertySymUse = (PropertySym *)0x0;
  pBVar12 = (BVSparse<Memory::JitArenaAllocator> *)
            new<Memory::JitArenaAllocator>(0x20,this->alloc,0x3eba5c);
  pJVar1 = this->alloc;
  pBVar12->head = (Type_conflict)0x0;
  pBVar12->lastFoundIndex = (Type_conflict)0x0;
  pBVar12->alloc = pJVar1;
  pBVar12->lastUsedNodePrevNextField = (Type)pBVar12;
  this->changedSymsAfterIncBailoutCandidate = pBVar12;
  pBVar12 = (BVSparse<Memory::JitArenaAllocator> *)
            new<Memory::JitArenaAllocator>(0x20,this->alloc,0x3eba5c);
  pJVar1 = this->alloc;
  pBVar12->head = (Type_conflict)0x0;
  pBVar12->lastFoundIndex = (Type_conflict)0x0;
  pBVar12->alloc = pJVar1;
  pBVar12->lastUsedNodePrevNextField = (Type)pBVar12;
  this->auxSlotPtrSyms = pBVar12;
  pBVar12 = (BVSparse<Memory::JitArenaAllocator> *)
            new<Memory::JitArenaAllocator>(0x20,this->alloc,0x3eba5c);
  pJVar1 = this->alloc;
  pBVar12->head = (Type_conflict)0x0;
  pBVar12->lastFoundIndex = (Type_conflict)0x0;
  pBVar12->alloc = pJVar1;
  pBVar12->lastUsedNodePrevNextField = (Type)pBVar12;
  this->byteCodeUsesBeforeOpt = pBVar12;
  bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,FieldCopyPropPhase);
  if (bVar5) {
    bVar5 = DoFunctionFieldCopyProp(this);
    if (bVar5) {
      Output::Print(L"TRACE: CanDoFieldCopyProp Func: ");
      Func::DumpFullFunctionName(this->func);
      Output::Print(L"\n");
    }
  }
  localNoImplicitCallUsesToInsert.
  super_ReadOnlyList<IR::Opnd_*,_Memory::JitArenaAllocator,_DefaultComparer>._16_8_ = this->alloc;
  localValuesCreatedForMerge.stats = (Type)&PTR_IsReadOnly_014d53b0;
  localNoImplicitCallUsesToInsert.
  super_ReadOnlyList<IR::Opnd_*,_Memory::JitArenaAllocator,_DefaultComparer>._vptr_ReadOnlyList =
       (_func_int **)0x0;
  localNoImplicitCallUsesToInsert.
  super_ReadOnlyList<IR::Opnd_*,_Memory::JitArenaAllocator,_DefaultComparer>.buffer._0_4_ = 0;
  localNoImplicitCallUsesToInsert.
  super_ReadOnlyList<IR::Opnd_*,_Memory::JitArenaAllocator,_DefaultComparer>.alloc =
       (Type)0x400000000;
  this->noImplicitCallUsesToInsert = (OpndList *)&localValuesCreatedForMerge.stats;
  JsUtil::
  BaseDictionary<long,_StackSym_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary((BaseDictionary<long,_StackSym_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    *)local_258,
                   (AllocatorType *)
                   localNoImplicitCallUsesToInsert.
                   super_ReadOnlyList<IR::Opnd_*,_Memory::JitArenaAllocator,_DefaultComparer>._16_8_
                   ,0);
  this->intConstantToStackSymMap =
       (BaseDictionary<long,_StackSym_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        *)local_258;
  JsUtil::
  BaseDictionary<int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary((BaseDictionary<int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    *)&localIntConstantToStackSymMap.stats,this->alloc,0);
  this->intConstantToValueMap = (IntConstantToValueMap *)&localIntConstantToStackSymMap.stats;
  JsUtil::
  BaseDictionary<long,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary((BaseDictionary<long,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    *)&localIntConstantToValueMap.stats,this->alloc,0);
  this->int64ConstantToValueMap = (Int64ConstantToValueMap *)&localIntConstantToValueMap.stats;
  JsUtil::
  BaseDictionary<void_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary((BaseDictionary<void_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    *)&localInt64ConstantToValueMap.stats,this->alloc,0);
  this->addrConstantToValueMap = (AddrConstantToValueMap *)&localInt64ConstantToValueMap.stats;
  JsUtil::
  BaseDictionary<Js::InternalString,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary((BaseDictionary<Js::InternalString,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    *)&localAddrConstantToValueMap.stats,this->alloc,0);
  this->stringConstantToValueMap = (StringConstantToValueMap *)&localAddrConstantToValueMap.stats;
  JsUtil::
  BaseDictionary<unsigned_int,_IR::Instr_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary((BaseDictionary<unsigned_int,_IR::Instr_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    *)&localStringConstantToValueMap.stats,this->alloc,0);
  this->prePassInstrMap = (SymIdToInstrMap *)&localStringConstantToValueMap.stats;
  JsUtil::
  BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary((BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                    *)&localPrePassInstrMap.stats,this->alloc,0x40);
  this->valuesCreatedForClone = (ValueSetByValueNumber *)&localPrePassInstrMap.stats;
  this_00 = &localValuesCreatedForClone.
             super_BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
             .stats;
  JsUtil::
  BaseDictionary<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary((BaseDictionary<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    *)this_00,this->alloc,0x40);
  this->valuesCreatedForMerge = (ValueNumberPairToValueMap *)this_00;
  pJVar1 = this->alloc;
  localNoImplicitCallUsesToInsert._40_8_ = 0;
  this->finishedStackLiteralInitFld =
       (BVSparse<Memory::JitArenaAllocator> *)&localNoImplicitCallUsesToInsert.field_0x28;
  pFVar13 = this->func;
  pBVar17 = pFVar13->m_fg->blockList;
  if (pBVar17 != (BasicBlock *)0x0) {
    do {
      pBVar2 = pBVar17->next;
      if ((pBVar17->field_0x18 & 1) == 0) {
        OptBlock(this,pBVar17);
      }
      pBVar17 = pBVar2;
    } while (pBVar2 != (BasicBlock *)0x0);
    pFVar13 = this->func;
  }
  pJVar9 = JITTimeWorkItem::GetJITFunctionBody(pFVar13->m_workItem);
  uVar6 = JITTimeFunctionBody::GetSourceContextId(pJVar9);
  pFVar10 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  uVar7 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar10);
  bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,MemOpPhase,uVar6,uVar7);
  if (!bVar5) {
    ProcessMemOp(this);
  }
  this->noImplicitCallUsesToInsert = (OpndList *)0x0;
  this->stringConstantToValueMap = (StringConstantToValueMap *)0x0;
  this->finishedStackLiteralInitFld = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->int64ConstantToValueMap = (Int64ConstantToValueMap *)0x0;
  this->addrConstantToValueMap = (AddrConstantToValueMap *)0x0;
  this->intConstantToStackSymMap = (IntConstantToStackSymMap *)0x0;
  this->intConstantToValueMap = (IntConstantToValueMap *)0x0;
  pBVar17 = this->func->m_fg->blockList;
  if (pBVar17 != (BasicBlock *)0x0) {
    uVar18 = 0;
    uVar19 = 0;
    do {
      if ((pBVar17->field_0x18 & 1) == 0) {
        bVar5 = pBVar17->dataUseCount == 0;
        uVar19 = uVar19 + bVar5;
        uVar18 = uVar18 + !bVar5;
        pBVar17->dataUseCount = 0;
        if (pBVar17->cloneStrCandidates != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
          Memory::
          DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
                    (this->alloc,pBVar17->cloneStrCandidates);
          pBVar17->cloneStrCandidates = (BVSparse<Memory::JitArenaAllocator> *)0x0;
        }
      }
      pBVar17 = pBVar17->next;
    } while (pBVar17 != (BasicBlock *)0x0);
    if (uVar19 < uVar18) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x1bb,"(freedCount >= spilledCount)","freedCount >= spilledCount");
      if (!bVar5) {
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar14 = 0;
    }
  }
  this->changedSymsAfterIncBailoutCandidate = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->auxSlotPtrSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  AutoCodeGenPhase::EndPhase((AutoCodeGenPhase *)local_40,this->func,ForwardPhase,true,true);
  if (localNoImplicitCallUsesToInsert._40_8_ != 0) {
    pBVar3 = (Type)localNoImplicitCallUsesToInsert._40_8_;
    pBVar16 = pJVar1->bvFreeList;
    do {
      pBVar15 = pBVar3;
      pBVar3 = pBVar15->next;
      pBVar15->next = pBVar16;
      pBVar16 = pBVar15;
    } while (pBVar3 != (Type)0x0);
    pJVar1->bvFreeList = pBVar15;
  }
  JsUtil::
  BaseDictionary<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary((BaseDictionary<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     *)&localValuesCreatedForClone.
                        super_BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                        .stats);
  JsUtil::
  BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary((BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                     *)&localPrePassInstrMap.stats);
  JsUtil::
  BaseDictionary<unsigned_int,_IR::Instr_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary((BaseDictionary<unsigned_int,_IR::Instr_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     *)&localStringConstantToValueMap.stats);
  JsUtil::
  BaseDictionary<Js::InternalString,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary((BaseDictionary<Js::InternalString,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     *)&localAddrConstantToValueMap.stats);
  JsUtil::
  BaseDictionary<void_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary((BaseDictionary<void_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     *)&localInt64ConstantToValueMap.stats);
  JsUtil::
  BaseDictionary<long,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary((BaseDictionary<long,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     *)&localIntConstantToValueMap.stats);
  JsUtil::
  BaseDictionary<int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary((BaseDictionary<int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     *)&localIntConstantToStackSymMap.stats);
  JsUtil::
  BaseDictionary<long,_StackSym_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary((BaseDictionary<long,_StackSym_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     *)local_258);
  localValuesCreatedForMerge.stats = (Type)&PTR_IsReadOnly_014d53b0;
  JsUtil::List<IR::Opnd_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::Reset((List<IR::Opnd_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           *)&localValuesCreatedForMerge.stats);
  AutoCodeGenPhase::~AutoCodeGenPhase((AutoCodeGenPhase *)local_40);
  return;
}

Assistant:

void
GlobOpt::ForwardPass()
{
    BEGIN_CODEGEN_PHASE(this->func, Js::ForwardPhase);

#if DBG_DUMP
    if (Js::Configuration::Global.flags.Trace.IsEnabled(Js::GlobOptPhase, this->func->GetSourceContextId(), this->func->GetLocalFunctionId()))
    {
        this->func->DumpHeader();
    }
    if (Js::Configuration::Global.flags.TestTrace.IsEnabled(Js::GlobOptPhase))
    {
        this->TraceSettings();
    }
#endif

    // GetConstantCount() gives us the right size to pick for the SparseArray, but we may need more if we've inlined
    // functions with constants. There will be a gap in the symbol numbering between the main constants and
    // the inlined ones, so we'll most likely need a new array chunk. Make the min size of the array chunks be 64
    // in case we have a main function with very few constants and a bunch of constants from inlined functions.
    this->byteCodeConstantValueArray = SparseArray<Value>::New(this->alloc, max(this->func->GetJITFunctionBody()->GetConstCount(), 64U));
    this->byteCodeConstantValueNumbersBv = JitAnew(this->alloc, BVSparse<JitArenaAllocator>, this->alloc);
    this->tempBv = JitAnew(this->alloc, BVSparse<JitArenaAllocator>, this->alloc);
    this->prePassCopyPropSym = JitAnew(this->alloc, BVSparse<JitArenaAllocator>, this->alloc);
    this->slotSyms = JitAnew(this->alloc, BVSparse<JitArenaAllocator>, this->alloc);
    this->byteCodeUses = nullptr;
    this->propertySymUse = nullptr;

    // changedSymsAfterIncBailoutCandidate helps track building incremental bailout in ForwardPass
    this->changedSymsAfterIncBailoutCandidate = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);

    this->auxSlotPtrSyms = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);

#if DBG
    this->byteCodeUsesBeforeOpt = JitAnew(this->alloc, BVSparse<JitArenaAllocator>, this->alloc);
    if (Js::Configuration::Global.flags.Trace.IsEnabled(Js::FieldCopyPropPhase) && this->DoFunctionFieldCopyProp())
    {
        Output::Print(_u("TRACE: CanDoFieldCopyProp Func: "));
        this->func->DumpFullFunctionName();
        Output::Print(_u("\n"));
    }
#endif

    OpndList localNoImplicitCallUsesToInsert(alloc);
    this->noImplicitCallUsesToInsert = &localNoImplicitCallUsesToInsert;
    IntConstantToStackSymMap localIntConstantToStackSymMap(alloc);
    this->intConstantToStackSymMap = &localIntConstantToStackSymMap;
    IntConstantToValueMap localIntConstantToValueMap(alloc);
    this->intConstantToValueMap = &localIntConstantToValueMap;
    Int64ConstantToValueMap localInt64ConstantToValueMap(alloc);
    this->int64ConstantToValueMap = &localInt64ConstantToValueMap;
    AddrConstantToValueMap localAddrConstantToValueMap(alloc);
    this->addrConstantToValueMap = &localAddrConstantToValueMap;
    StringConstantToValueMap localStringConstantToValueMap(alloc);
    this->stringConstantToValueMap = &localStringConstantToValueMap;
    SymIdToInstrMap localPrePassInstrMap(alloc);
    this->prePassInstrMap = &localPrePassInstrMap;
    ValueSetByValueNumber localValuesCreatedForClone(alloc, 64);
    this->valuesCreatedForClone = &localValuesCreatedForClone;
    ValueNumberPairToValueMap localValuesCreatedForMerge(alloc, 64);
    this->valuesCreatedForMerge = &localValuesCreatedForMerge;

#if DBG
    BVSparse<JitArenaAllocator> localFinishedStackLiteralInitFld(alloc);
    this->finishedStackLiteralInitFld = &localFinishedStackLiteralInitFld;
#endif

    FOREACH_BLOCK_IN_FUNC_EDITING(block, this->func)
    {
        this->OptBlock(block);
    } NEXT_BLOCK_IN_FUNC_EDITING;

    if (!PHASE_OFF(Js::MemOpPhase, this->func))
    {
        ProcessMemOp();
    }

    this->noImplicitCallUsesToInsert = nullptr;
    this->intConstantToStackSymMap = nullptr;
    this->intConstantToValueMap = nullptr;
    this->int64ConstantToValueMap = nullptr;
    this->addrConstantToValueMap = nullptr;
    this->stringConstantToValueMap = nullptr;
#if DBG
    this->finishedStackLiteralInitFld = nullptr;
    uint freedCount = 0;
    uint spilledCount = 0;
#endif

    FOREACH_BLOCK_IN_FUNC(block, this->func)
    {
#if DBG
        if (block->GetDataUseCount() == 0)
        {
            freedCount++;
        }
        else
        {
            spilledCount++;
        }
#endif
        block->SetDataUseCount(0);
        if (block->cloneStrCandidates)
        {
            JitAdelete(this->alloc, block->cloneStrCandidates);
            block->cloneStrCandidates = nullptr;
        }
    } NEXT_BLOCK_IN_FUNC;

    // Make sure we free most of them.
    Assert(freedCount >= spilledCount);

    // this->alloc will be freed right after return, no need to free it here
    this->changedSymsAfterIncBailoutCandidate = nullptr;
    this->auxSlotPtrSyms = nullptr;

    END_CODEGEN_PHASE(this->func, Js::ForwardPhase);
}